

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.c
# Opt level: O2

lys_submodule *
ly_ctx_get_submodule(ly_ctx *ctx,char *module,char *revision,char *submodule,char *sub_revision)

{
  lys_submodule *plVar1;
  int iVar2;
  lys_module *main_module;
  lys_submodule *plVar3;
  LY_ERR *pLVar4;
  uint32_t local_3c;
  lys_submodule *plStack_38;
  uint32_t idx;
  
  local_3c = 0;
  if ((submodule == (char *)0x0 || ctx == (ly_ctx *)0x0) ||
     (module == (char *)0x0 && revision != (char *)0x0)) {
    pLVar4 = ly_errno_location();
    *pLVar4 = LY_EINVAL;
    plVar3 = (lys_submodule *)0x0;
  }
  else {
    plVar1 = (lys_submodule *)0x0;
    do {
      while( true ) {
        do {
          plStack_38 = plVar1;
          main_module = ly_ctx_get_module_iter(ctx,&local_3c);
          if (main_module == (lys_module *)0x0) {
            return plStack_38;
          }
        } while ((((module != (char *)0x0) &&
                  (iVar2 = strcmp(main_module->name,module), plVar1 = plStack_38, iVar2 != 0)) ||
                 ((revision != (char *)0x0 &&
                  ((plVar1 = plStack_38, main_module->rev == (lys_revision *)0x0 ||
                   (iVar2 = strcmp(revision,main_module->rev->date), plVar1 = plStack_38, iVar2 != 0
                   )))))) ||
                (plVar3 = ly_ctx_get_submodule2(main_module,submodule), plVar1 = plStack_38,
                plVar3 == (lys_submodule *)0x0));
        if (sub_revision != (char *)0x0) break;
        plVar1 = plVar3;
        if ((((plStack_38 != (lys_submodule *)0x0) &&
             (plVar1 = plStack_38, plVar3->rev != (lys_revision *)0x0)) &&
            (plVar1 = plVar3, plStack_38->rev != (lys_revision *)0x0)) &&
           (iVar2 = strcmp(plVar3->rev->date,plStack_38->rev->date), plVar1 = plStack_38, 0 < iVar2)
           ) {
          plVar1 = plVar3;
        }
      }
    } while ((plVar3->rev == (lys_revision *)0x0) ||
            (iVar2 = strcmp(sub_revision,plVar3->rev->date), plVar1 = plStack_38, iVar2 != 0));
  }
  return plVar3;
}

Assistant:

lys_submodule *
ly_ctx_get_submodule(const struct ly_ctx *ctx, const char *module, const char *revision, const char *submodule,
                     const char *sub_revision)
{
    const struct lys_module *mainmod;
    const struct lys_submodule *ret = NULL, *submod;
    uint32_t idx = 0;

    if (!ctx || !submodule || (revision && !module)) {
        ly_errno = LY_EINVAL;
        return NULL;
    }

    while ((mainmod = ly_ctx_get_module_iter(ctx, &idx))) {
        if (module && strcmp(mainmod->name, module)) {
            /* main module name does not match */
            continue;
        }

        if (revision && (!mainmod->rev || strcmp(revision, mainmod->rev[0].date))) {
            /* main module revision does not match */
            continue;
        }

        submod = ly_ctx_get_submodule2(mainmod, submodule);
        if (!submod) {
            continue;
        }

        if (!sub_revision) {
            /* store only if newer */
            if (ret) {
                if (submod->rev && (!ret->rev || (strcmp(submod->rev[0].date, ret->rev[0].date) > 0))) {
                    ret = submod;
                }
            } else {
                ret = submod;
            }
        } else {
            /* store only if revision matches, we are done if it does */
            if (!submod->rev) {
                continue;
            } else if (!strcmp(sub_revision, submod->rev[0].date)) {
                ret = submod;
                break;
            }
        }
    }

    return ret;
}